

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetClassFullName
          (ClassNameResolver *this,string *name_without_package,FileDescriptor *file,bool immutable,
          bool multiple_files)

{
  ulong uVar1;
  string *in_RDX;
  string *in_RDI;
  byte in_R8B;
  byte in_R9B;
  string *result;
  string local_78 [23];
  undefined1 in_stack_ffffffffffffff9f;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  FileDescriptor *in_stack_ffffffffffffffa8;
  string local_48 [37];
  undefined1 local_23;
  byte local_22;
  byte local_21;
  string *local_18;
  
  local_21 = in_R8B & 1;
  local_22 = in_R9B & 1;
  local_23 = 0;
  local_18 = in_RDX;
  std::__cxx11::string::string((string *)in_RDI);
  if ((local_22 & 1) == 0) {
    GetClassName_abi_cxx11_
              ((ClassNameResolver *)in_stack_ffffffffffffffa8,
               (FileDescriptor *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               (bool)in_stack_ffffffffffffff9f);
    std::__cxx11::string::operator=((string *)in_RDI,local_78);
    std::__cxx11::string::~string(local_78);
  }
  else {
    FileJavaPackage_abi_cxx11_(in_stack_ffffffffffffffa8,(bool)in_stack_ffffffffffffffa7);
    std::__cxx11::string::operator=((string *)in_RDI,local_48);
    std::__cxx11::string::~string(local_48);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,'.');
  }
  std::__cxx11::string::operator+=((string *)in_RDI,local_18);
  return in_RDI;
}

Assistant:

std::string ClassNameResolver::GetClassFullName(
    const std::string& name_without_package, const FileDescriptor* file,
    bool immutable, bool multiple_files) {
  std::string result;
  if (multiple_files) {
    result = FileJavaPackage(file, immutable);
  } else {
    result = GetClassName(file, immutable);
  }
  if (!result.empty()) {
    result += '.';
  }
  result += name_without_package;
  return result;
}